

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int anycb(int f)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  buffer *bp;
  bool bVar6;
  char local_448 [8];
  char pbuf [1035];
  
  if (bheadp == (buffer *)0x0) {
    bVar6 = true;
    iVar4 = 0;
  }
  else {
    iVar3 = 0;
    iVar5 = 0;
    iVar4 = 0;
    bp = bheadp;
    do {
      if ((bp->b_fname[0] != '\0') && ((bp->b_flag & 1U) != 0)) {
        uVar1 = snprintf(local_448,0x40b,"Save file %s",bp->b_fname);
        if (0x40a < uVar1) {
          dobeep_msg("Error: filename too long!");
          return 3;
        }
        if (f == 1) {
LAB_00109185:
          iVar2 = iVar5;
          iVar3 = buffsave(bp);
          if (iVar3 != 1) goto LAB_001091af;
          bp->b_flag = bp->b_flag & 0xfe;
          upmodes(bp);
          iVar3 = 1;
        }
        else {
          iVar2 = eyorn(local_448);
          iVar5 = 1;
          if (iVar2 == 1) goto LAB_00109185;
LAB_001091af:
          iVar4 = 1;
          if (iVar3 == 3) {
            return 3;
          }
        }
        iVar5 = 1;
        if (iVar2 == 2) {
          return 2;
        }
      }
      bp = (bp->b_list).l_p.x_bp;
    } while (bp != (buffer *)0x0);
    bVar6 = iVar5 == 0;
  }
  if (bVar6) {
    ewprintf("(No files need saving)");
  }
  return iVar4;
}

Assistant:

int
anycb(int f)
{
	struct buffer	*bp;
	int		 s = FALSE, save = FALSE, save2 = FALSE, ret;
	char		 pbuf[NFILEN + 11];

	for (bp = bheadp; bp != NULL; bp = bp->b_bufp) {
		if (*(bp->b_fname) != '\0' && (bp->b_flag & BFCHG) != 0) {
			ret = snprintf(pbuf, sizeof(pbuf), "Save file %s",
			    bp->b_fname);
			if (ret < 0 || ret >= sizeof(pbuf)) {
				(void)dobeep_msg("Error: filename too long!");
				return (UERROR);
			}
			if ((f == TRUE || (save = eyorn(pbuf)) == TRUE) &&
			    (save2 = buffsave(bp)) == TRUE) {
				bp->b_flag &= ~BFCHG;
				upmodes(bp);
			} else {
				if (save2 == FIOERR)
					return (save2);
				s = TRUE;
			}
			if (save == ABORT)
				return (save);
			save = TRUE;
		}
	}
	if (save == FALSE /* && kbdmop == NULL */ )	/* experimental */
		ewprintf("(No files need saving)");
	return (s);
}